

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_ClippingPlaneData *
GetClippingPlaneData(ON_ClippingPlaneDataStore *dataStore,bool createIfMissing)

{
  bool bVar1;
  ON_ClippingPlaneData *pOVar2;
  
  bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
  pOVar2 = ON_ClippingPlaneDataList::FromSerialNumber(&g_data_list,dataStore->m_sn);
  if (pOVar2 == (ON_ClippingPlaneData *)0x0) {
    pOVar2 = ON_ClippingPlaneDataList::AppendNew(&g_data_list);
    if (pOVar2 == (ON_ClippingPlaneData *)0x0) {
      pOVar2 = (ON_ClippingPlaneData *)0x0;
    }
    else {
      dataStore->m_sn = pOVar2->m_sn;
    }
  }
  if (bVar1) {
    ON_SleepLock::ReturnLock(&g_data_list_lock);
  }
  return pOVar2;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(ON_ClippingPlaneDataStore& dataStore, bool createIfMissing)
{
  bool bReturnLock = g_data_list_lock.GetLock();

  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(dataStore.m_sn);
  if (nullptr==rc && createIfMissing)
  {
    rc = g_data_list.AppendNew();
    if (rc)
      dataStore.m_sn = rc->m_sn;
  }
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}